

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flash.c
# Opt level: O3

void write_byte_flash(gbamem_t *mem,gbabus_t *bus,uint32_t address,uint8_t value)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  switch(mem->flash_state) {
  case FLASH_READY:
  case FLASH_CHIP_ID:
    if (address != 0xe005555) {
LAB_0011f6c0:
      write_byte_flash_cold_9();
      goto LAB_0011f6c7;
    }
    if (value != 0xf0) {
      mem->flash_command = (uint)value;
      mem->flash_state = FLASH_CMD_1;
      return;
    }
    break;
  case FLASH_CMD_1:
    if (address == 0xe002aaa) {
      mem->flash_command = (uint)value | mem->flash_command << 8;
      mem->flash_state = FLASH_CMD_2;
      return;
    }
    goto LAB_0011f6d8;
  case FLASH_CMD_2:
    if (address == 0xe005555) {
      mem->flash_command = (uint)value | mem->flash_command << 8;
      complete_flash_command(mem,(gbabus_t *)&switchD_0011f45a::switchdataD_00128268);
      return;
    }
    goto LAB_0011f6df;
  case FLASH_ERASE:
    if (address == 0xe005555) {
      mem->flash_command = (uint)value;
      mem->flash_state = FLASH_ERASE_1;
      return;
    }
LAB_0011f6c7:
    write_byte_flash_cold_6();
LAB_0011f6ce:
    write_byte_flash_cold_1();
LAB_0011f6d8:
    write_byte_flash_cold_8();
LAB_0011f6df:
    write_byte_flash_cold_7();
LAB_0011f6e6:
    write_byte_flash_cold_3();
LAB_0011f6eb:
    write_byte_flash_cold_5();
LAB_0011f6f2:
    write_byte_flash_cold_2();
  case FLASH_ERASE_1:
    if (address == 0xe002aaa) {
      mem->flash_command = (uint)value | mem->flash_command << 8;
      mem->flash_state = FLASH_ERASE_2;
      return;
    }
    goto LAB_0011f6eb;
  case FLASH_ERASE_2:
    uVar3 = (uint)value | mem->flash_command << 8;
    mem->flash_command = uVar3;
    if (uVar3 == 0xaa5510 && address == 0xe005555) {
      memset(mem->backup,0xff,mem->backup_size);
      (bus->ime_temp).field_0 =
           (anon_struct_2_1_53b916c1_for_interrupt_master_enable_0)
           (bus->interrupt_master_enable).raw;
      (bus->interrupt_master_enable).raw = (bus->interrupt_master_enable).raw & 0xfffe;
    }
    else {
      iVar2 = 0;
      do {
        iVar4 = 0;
        if (bus->backup_type == FLASH128K) {
          iVar4 = (uint)mem->flash_bank * 0x10000 - (uint)mem->flash_bank;
        }
        uVar5 = (ulong)(iVar4 + (address & 0xf000) + iVar2);
        if (mem->backup_size <= uVar5) {
          write_byte_flash_cold_4();
          goto LAB_0011f6c0;
        }
        mem->backup[uVar5] = 0xff;
        iVar2 = iVar2 + 1;
      } while (iVar2 != 0x1000);
    }
    mem->backup_dirty = true;
    break;
  case FLASH_ERASE_WRITE_SECTOR:
    if (mem->flash_erase_write_sector_first_address == 0) {
      mem->flash_erase_write_sector_first_address = address;
    }
    uVar1 = address & 0xffff;
    uVar3 = uVar1;
    if ((bus->backup_type == FLASH128K) && (uVar3 = uVar1 + 0xffff, mem->flash_bank != '\x01')) {
      uVar3 = uVar1;
    }
    if ((ulong)uVar3 < mem->backup_size) {
      mem->backup[uVar3] = value;
      if (address - 0x7f == mem->flash_erase_write_sector_first_address) {
        bus->interrupt_master_enable = bus->ime_temp;
        mem->flash_erase_write_sector_first_address = 0;
        mem->flash_state = FLASH_READY;
      }
      goto LAB_0011f653;
    }
    goto LAB_0011f6e6;
  case FLASH_WRITE_SINGLE_BYTE:
    uVar1 = address & 0xffff;
    uVar3 = uVar1;
    if ((bus->backup_type == FLASH128K) && (uVar3 = uVar1 + 0xffff, mem->flash_bank != '\x01')) {
      uVar3 = uVar1;
    }
    mem->backup[uVar3] = value;
    mem->flash_state = FLASH_READY;
LAB_0011f653:
    mem->backup_dirty = true;
    return;
  case FLASH_BANKSWITCH:
    if (address != 0xe000000) goto LAB_0011f6ce;
    if (1 < value) goto LAB_0011f6f2;
    mem->flash_bank = value;
    break;
  default:
    goto switchD_0011f45a_default;
  }
  mem->flash_state = FLASH_READY;
switchD_0011f45a_default:
  return;
}

Assistant:

void write_byte_flash(gbamem_t* mem, gbabus_t* bus, word address, byte value) {
#ifdef FLASH_VERBOSE_LOG
    printf("%d [0x%08X] = 0x%02X\n", mem->flash_state, address, value);
#endif
    switch (mem->flash_state) {
        case FLASH_READY:
        case FLASH_CHIP_ID:
            if (address != 0xE005555) {
                logfatal("FLASH_[CMD_READY/CHIP_ID] Tried to write to address that wasn't 0xE005555! (0x%08X)", address)
            }
            if (value == 0xF0) {
                mem->flash_state = FLASH_READY;
            } else {
                mem->flash_command = value;
                mem->flash_state = FLASH_CMD_1;
            }
            break;
        case FLASH_CMD_1:
            if (address != 0xE002AAA) {
                logfatal("FLASH_CMD_1: Tried to write to address that wasn't 0xE002AAA! (0x%08X)", address)
            }
            mem->flash_command <<= 8;
            mem->flash_command |= value;
            mem->flash_state = FLASH_CMD_2;
            break;
        case FLASH_CMD_2:
            if (address != 0xE005555) {
                logfatal("FLASH_CMD_2: Tried to write to address that wasn't 0xE005555! (0x%08X)", address)
            }
            mem->flash_command <<= 8;
            mem->flash_command |= value;
            complete_flash_command(mem, bus);
            break;
        case FLASH_ERASE:
            if (address != 0xE005555) {
                logfatal("FLASH_ERASE Tried to write to address that wasn't 0xE005555! (0x%08X)", address)
            }
            mem->flash_command = value;
            mem->flash_state = FLASH_ERASE_1;
            break;
        case FLASH_ERASE_1:
            if (address != 0xE002AAA) {
                logfatal("FLASH_ERASE_1: Tried to write to address that wasn't 0xE002AAA! (0x%08X)", address)
            }
            mem->flash_command <<= 8;
            mem->flash_command |= value;
            mem->flash_state = FLASH_ERASE_2;
            break;
        case FLASH_ERASE_2:
            mem->flash_command <<= 8;
            mem->flash_command |= value;

            if (address == 0xE005555 && mem->flash_command == FLASHC_ERASE_ENTIRE_CHIP) {
#ifdef FLASH_VERBOSE_LOG
                printf("FLASHC_ERASE_ENTIRE_CHIP\n");
#endif
                memset(mem->backup, 0xFF, mem->backup_size);
                bus->ime_temp.raw = bus->interrupt_master_enable.raw;
                bus->interrupt_master_enable.enable = false;
                mem->backup_dirty = true;
            } else {
#ifdef FLASH_VERBOSE_LOG
                printf("FLASHC_ERASE_BLOCK\n");
#endif
                word start = address & 0x000F000;
                // TODO: Replace with memset?
                for (word block = 0x000; block < 0x1000; block++) {
                    word erase_address = start | block;
                    word index = erase_address + (bus->backup_type == FLASH128K ? mem->flash_bank * 0xFFFF : 0);
                    unimplemented(index >= mem->backup_size, "Out of bounds access to backup!")
                    mem->backup[index] = 0xFF;
                }
                mem->backup_dirty = true;
            }
            // The games are told to wait until a given value == 0xFF
            // Since we're erasing by overwriting with 0xFFs, we can just go back into FLASH_READY mode
#ifdef FLASH_VERBOSE_LOG
            printf("FLASH_READY\n");
#endif
            mem->flash_state = FLASH_READY;
            break;
        case FLASH_ERASE_WRITE_SECTOR: {
            if (mem->flash_erase_write_sector_first_address == 0) {
                mem->flash_erase_write_sector_first_address = address;
            }
            word index = address & 0xFFFF;
            if (bus->backup_type == FLASH128K && mem->flash_bank == 1) {
                index += 0xFFFF;
            }
            unimplemented(index >= mem->backup_size, "Out of bounds access to backup!")
            mem->backup[index] = value;
            if ((address - 0x7F) == mem->flash_erase_write_sector_first_address) {
                bus->interrupt_master_enable.raw = bus->ime_temp.raw;
                mem->flash_erase_write_sector_first_address = 0;
                mem->flash_state = FLASH_READY;
            }
            mem->backup_dirty = true;
            break;
        }
        case FLASH_WRITE_SINGLE_BYTE: {
            word index = address & 0xFFFF;
            if (bus->backup_type == FLASH128K && mem->flash_bank == 1) {
                index += 0xFFFF;
            }
            mem->backup[index] = value;
            mem->flash_state = FLASH_READY;
            mem->backup_dirty = true;
            break;
        }
        case FLASH_BANKSWITCH:
            if (address == 0xE000000) {
                unimplemented(value > 1, "Tried to switch flash bank to nonexistent bank (>1)")
                mem->flash_bank = value;
                mem->flash_state = FLASH_READY;
            } else {
                logfatal("Unimplemented: BANK_SWITCH: [0x%08X] = 0x%02X", address, value)
            }
            break;
    }
}